

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

monst * findgd(void)

{
  boolean bVar1;
  monst *local_18;
  monst *mtmp;
  
  local_18 = level->monlist;
  while( true ) {
    if (local_18 == (monst *)0x0) {
      return (monst *)0x0;
    }
    if ((((*(uint *)&local_18->field_0x60 >> 0x1b & 1) != 0) && (0 < local_18->mhp)) &&
       (bVar1 = on_level((d_level *)((long)&local_18[1].data + 4),&u.uz), bVar1 != '\0')) break;
    local_18 = local_18->nmon;
  }
  return local_18;
}

Assistant:

static struct monst *findgd(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    if (mtmp->isgd && !DEADMONSTER(mtmp) && on_level(&(EGD(mtmp)->gdlevel), &u.uz))
		return mtmp;
	return NULL;
}